

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void PIT_CeilingLower(AActor *thing,FChangePosition *cpos)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  TFlags<ActorFlag4,_unsigned_int> local_2c;
  double local_28;
  double oldz;
  FChangePosition *pFStack_18;
  bool onfloor;
  FChangePosition *cpos_local;
  AActor *thing_local;
  
  pFStack_18 = cpos;
  cpos_local = (FChangePosition *)thing;
  local_28 = AActor::Z(thing);
  dVar3 = AActor::Z((AActor *)cpos_local);
  oldz._7_1_ = dVar3 <= (double)cpos_local[0xc].sector;
  P_AdjustFloorCeil((AActor *)cpos_local,pFStack_18);
  dVar3 = AActor::Top((AActor *)cpos_local);
  if (cpos_local[0xc].moveamt <= dVar3 && dVar3 != cpos_local[0xc].moveamt) {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_2c,
               (int)cpos_local + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
    if (uVar1 != 0) {
      pFStack_18->nofit = true;
      return;
    }
    TArray<AActor_*,_AActor_*>::Clear(&intersectors);
    if (cpos_local[0xc].moveamt - *(double *)&cpos_local[0xe].crushchange <
        (double)cpos_local[0xc].sector) {
      AActor::SetZ((AActor *)cpos_local,(double)cpos_local[0xc].sector,true);
    }
    else {
      AActor::SetZ((AActor *)cpos_local,
                   cpos_local[0xc].moveamt - *(double *)&cpos_local[0xe].crushchange,true);
    }
    AActor::UpdateRenderSectorList((AActor *)cpos_local);
    iVar2 = P_PushDown((AActor *)cpos_local,pFStack_18);
    if (iVar2 == 1 || iVar2 == 2) {
      if ((oldz._7_1_ & 1) != 0) {
        AActor::SetZ((AActor *)cpos_local,(double)cpos_local[0xc].sector,true);
      }
      P_DoCrunch((AActor *)cpos_local,pFStack_18);
      P_CheckFakeFloorTriggers((AActor *)cpos_local,local_28,false);
      AActor::UpdateRenderSectorList((AActor *)cpos_local);
    }
    else {
      P_CheckFakeFloorTriggers((AActor *)cpos_local,local_28,false);
      AActor::UpdateRenderSectorList((AActor *)cpos_local);
    }
  }
  if ((cpos_local[0x15].moveamt != 0.0) &&
     (*(FChangePosition **)cpos_local[0x15].moveamt == cpos_local)) {
    dVar3 = AActor::Z((AActor *)cpos_local);
    *(double *)((long)cpos_local[0x15].moveamt + 0x60) =
         (dVar3 - local_28) + *(double *)((long)cpos_local[0x15].moveamt + 0x60);
  }
  return;
}

Assistant:

void PIT_CeilingLower(AActor *thing, FChangePosition *cpos)
{
	bool onfloor;
	double oldz = thing->Z();

	onfloor = thing->Z() <= thing->floorz;
	P_AdjustFloorCeil(thing, cpos);

	if (thing->Top() > thing->ceilingz)
	{
		if (thing->flags4 & MF4_ACTLIKEBRIDGE)
		{
			cpos->nofit = true;
			return; // do not move bridge things
		}
		intersectors.Clear();
		if (thing->ceilingz - thing->Height >= thing->floorz)
		{
			thing->SetZ(thing->ceilingz - thing->Height);
		}
		else
		{
			thing->SetZ(thing->floorz);
		}
		thing->UpdateRenderSectorList();
		switch (P_PushDown(thing, cpos))
		{
		case 2:
			// intentional fall-through
		case 1:
			if (onfloor)
				thing->SetZ(thing->floorz);
			P_DoCrunch(thing, cpos);
			P_CheckFakeFloorTriggers(thing, oldz);
			thing->UpdateRenderSectorList();
			break;
		default:
			P_CheckFakeFloorTriggers(thing, oldz);
			thing->UpdateRenderSectorList();
			break;
		}
	}
	if (thing->player && thing->player->mo == thing)
	{
		thing->player->viewz += thing->Z() - oldz;
	}
}